

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# movegen.h
# Opt level: O0

void puppup::movegen::print(Move *mov,State *state,Gaddag *gaddag)

{
  ostream *this;
  long lVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  byte bVar4;
  undefined8 auStack_2098 [514];
  ostream *local_1088;
  ostream *local_1080;
  undefined8 *local_1078;
  State *local_1070;
  string *local_1068;
  ostream *local_1060;
  undefined8 local_1048 [513];
  string local_40 [32];
  Gaddag *local_20;
  Gaddag *gaddag_local;
  State *state_local;
  Move *mov_local;
  
  bVar4 = 0;
  local_20 = gaddag;
  gaddag_local = (Gaddag *)state;
  state_local = (State *)mov;
  if (mov->word == -1) {
    this = std::operator<<((ostream *)&std::cout,"CHANGE 7");
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  }
  local_1070 = state_local;
  local_1078 = local_1048;
  memcpy(local_1078,gaddag_local,0x1008);
  puVar2 = local_1078;
  puVar3 = auStack_2098;
  for (lVar1 = 0x201; lVar1 != 0; lVar1 = lVar1 + -1) {
    *puVar3 = *puVar2;
    puVar2 = puVar2 + (ulong)bVar4 * -2 + 1;
    puVar3 = puVar3 + (ulong)bVar4 * -2 + 1;
  }
  local_1068 = local_40;
  toString_abi_cxx11_(local_1068,local_1070,local_20);
  local_1060 = std::operator<<((ostream *)&std::cout,local_1068);
  local_1080 = std::operator<<(local_1060," ");
  local_1088 = (ostream *)std::ostream::operator<<(local_1080,state_local->score);
  std::ostream::operator<<(local_1088,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_40);
  return;
}

Assistant:

inline void print(const Move& mov, const board::State& state,
                  const trie::Gaddag& gaddag) {
    if (mov.word == -1) {
        std::cout << "CHANGE 7" << std::endl;
    }
    std::cout << toString(mov, state, gaddag) << " " << mov.score << std::endl;
}